

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

string * convert(char *from,char *to,char *_src,size_t size,string *out)

{
  byte bVar1;
  bool bVar2;
  iconv_t __cd;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  ostream *poVar6;
  byte *pbVar7;
  size_t sVar8;
  uint uVar9;
  char cVar10;
  bool bVar11;
  char *src;
  size_t dst_len;
  string orig_src;
  size_t src_len;
  char *dst;
  char to_ignore [100];
  byte *local_f8;
  char *local_f0;
  char *local_e8;
  string *local_e0;
  size_t local_d8;
  byte *local_d0 [2];
  byte local_c0 [16];
  pointer local_b0;
  size_t local_a8;
  pointer local_a0;
  char local_98 [104];
  
  if (size == 0) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,0x15654c);
  }
  else {
    local_d0[0] = local_c0;
    local_f0 = from;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,_src,_src + size);
    sVar8 = size * 2 + 10;
    cVar10 = (char)sVar8;
    std::__cxx11::string::resize((ulong)out,cVar10);
    local_b0 = (out->_M_dataplus)._M_p;
    local_e8 = to;
    sprintf(local_98,"%s//IGNORE",to);
    __cd = iconv_open(local_98,local_f0);
    if (__cd == (iconv_t)0xffffffffffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"iconv_open error: ",0x12);
      pcVar5 = local_f0;
      if (local_f0 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x16b470);
      }
      else {
        sVar8 = strlen(local_f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," -> ",4);
      pcVar5 = local_e8;
      if (local_e8 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x16b470);
      }
      else {
        sVar8 = strlen(local_e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,0x15654c);
    }
    else {
      bVar11 = false;
      uVar9 = 0;
      local_e0 = out;
      do {
        local_f8 = local_d0[0];
        local_a0 = local_b0;
        local_d8 = sVar8;
        local_a8 = size;
        sVar3 = iconv(__cd,(char **)&local_f8,&local_a8,&local_a0,&local_d8);
        if ((sVar3 == 0xffffffffffffffff) && ((ulong)((long)local_f8 - (long)local_d0[0]) < size)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"iconv failed: ",0xe);
          pcVar5 = local_f0;
          if (local_f0 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x16b470);
          }
          else {
            sVar3 = strlen(local_f0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,",",1);
          pcVar5 = local_e8;
          if (local_e8 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x16b470);
          }
          else {
            sVar3 = strlen(local_e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x16b470);
          }
          else {
            sVar3 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"at ",3);
          poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pbVar7 = local_f8;
          if (local_f8 + (2 - (long)local_d0[0]) < size) {
            bVar1 = *local_f8;
            *local_f8 = 0x20;
            bVar2 = true;
            if (bVar1 < 0x81) goto LAB_0014bf6e;
            pbVar7 = local_f8 + 1;
          }
          *pbVar7 = 0x20;
          bVar2 = true;
        }
        else {
          iconv_close(__cd);
          bVar2 = false;
          std::__cxx11::string::resize((ulong)local_e0,cVar10 - (char)local_d8);
        }
LAB_0014bf6e:
        out = local_e0;
        if (!bVar2) break;
        bVar11 = 0x62 < uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 100);
      if (bVar11) {
        std::__cxx11::string::resize((ulong)local_e0,'\0');
      }
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
  }
  return out;
}

Assistant:

static std::string& convert(const char* from, const char* to, const char* _src, size_t size, std::string* out)
{
    // std::cout<<"convert " << from <<"," << to << "," << size << std::endl;
    if (size == 0 ) {
        *out = "";
        return *out;
    }

    std::string orig_src(_src, size);

    size_t buf_len = size*2 + 10;
    out->resize(buf_len);

    char* out_buf = (char*)out->data();

    char to_ignore[100];
    // char from_ignore[100];
    sprintf(to_ignore, "%s//IGNORE", to);
    iconv_t ic = iconv_open(to_ignore, from);
    // iconv_t ic = iconv_open(to, from);

    if ((size_t)ic == -1) {
        std::cerr << "iconv_open error: " << from << " -> " << to << std::endl;
        *out = "";
        return *out;
    }


    //while (true) {
    for (int i = 0; i < 100; i++) { // max try 100
        char* src = (char*)orig_src.data();
        char* dst = out_buf;
        size_t dst_len = buf_len;
        size_t src_len = size;

        size_t ret = iconv(ic, (char**)&src, &src_len, &dst, &dst_len);
        if ( (ret == (size_t)-1) && (src - orig_src.data() < size) ) {
            std::cerr << "iconv failed: " << from << "," << to << ":" << strerror(errno)
                << "at " << (src - orig_src.data()) << std::endl;

            if (src - orig_src.data() + 2 < size) {
                if ((uint8_t)src[0] > 0x80 ) {
                    src[0] = ' ';
                    src[1] = ' ';
                }
                else {
                    src[0] = ' ';
                }
            } else {
                src[0] = ' ';
            }
            continue;
        } else {
            iconv_close(ic);
            out->resize(buf_len - dst_len);            
            return *out;
        }
    }
    out->resize(0);
    return *out;
}